

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O1

void NGA_Inquire(int g_a,int *type,int *ndim,int *dims)

{
  long lVar1;
  Integer *dims_00;
  Integer ttype;
  Integer nndim;
  Integer _ga_dims [7];
  int local_78 [2];
  long local_70;
  Integer local_68 [8];
  
  dims_00 = local_68;
  pnga_inquire((long)g_a,(Integer *)local_78,&local_70,dims_00);
  lVar1 = local_70;
  if (0 < local_70) {
    do {
      dims[lVar1 + -1] = (int)*dims_00;
      dims_00 = dims_00 + 1;
      lVar1 = lVar1 + -1;
    } while (lVar1 != 0);
  }
  *ndim = (int)local_70;
  *type = local_78[0];
  return;
}

Assistant:

void NGA_Inquire(int g_a, int *type, int *ndim, int dims[])
{
     Integer a=(Integer)g_a;
     Integer ttype, nndim;
     Integer _ga_dims[MAXDIM];
     wnga_inquire(a,&ttype, &nndim, _ga_dims);
     COPYF2C(_ga_dims, dims,nndim);  
     *ndim = (int)nndim;
     *type = (int)ttype;
}